

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::ResolveTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pSrcTexture,ITexture *pDstTexture,
          ResolveTextureSubresourceAttribs *ResolveAttribs)

{
  TextureVkImpl *Texture;
  TextureVkImpl *Texture_00;
  TextureDesc *TexDesc;
  Char *pCVar1;
  TextureFormatAttribs *pTVar2;
  VkImage srcImage;
  VkImage dstImage;
  MipLevelProperties local_138;
  MipLevelProperties *local_108;
  MipLevelProperties *MipAttribs;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 uStack_f0;
  undefined4 local_ec;
  undefined1 local_e8 [8];
  VkImageResolve ResolveRegion;
  VkImageAspectFlags aspectMask;
  string msg_1;
  TextureFormatAttribs *ResolveFmtAttribs;
  undefined1 local_68 [8];
  string msg;
  TextureDesc *DstTexDesc;
  TextureDesc *SrcTexDesc;
  TextureVkImpl *pDstTexVk;
  TextureVkImpl *pSrcTexVk;
  ResolveTextureSubresourceAttribs *ResolveAttribs_local;
  ITexture *pDstTexture_local;
  ITexture *pSrcTexture_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::ResolveTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcTexture,pDstTexture,
             ResolveAttribs);
  Texture = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pSrcTexture);
  Texture_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pDstTexture);
  TexDesc = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       *)Texture);
  msg.field_2._8_8_ =
       DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>::
       GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                *)Texture_00);
  if (TexDesc->Format != ((TextureDesc *)msg.field_2._8_8_)->Format) {
    FormatString<char[104]>
              ((string *)local_68,
               (char (*) [104])
               "Vulkan requires that source and destination textures of a resolve operation have the same format (18.6)"
              );
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd86);
    std::__cxx11::string::~string((string *)local_68);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTextureState
            (this,Texture,ResolveAttribs->SrcTextureTransitionMode,RESOURCE_STATE_RESOLVE_SOURCE,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  TransitionOrVerifyTextureState
            (this,Texture_00,ResolveAttribs->DstTextureTransitionMode,RESOURCE_STATE_RESOLVE_DEST,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  pTVar2 = GetTextureFormatAttribs(TexDesc->Format);
  if ((pTVar2->ComponentType == COMPONENT_TYPE_DEPTH) ||
     (pTVar2->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) {
    FormatString<char[55]>
              ((string *)&ResolveRegion.extent.depth,
               (char (*) [55])"Vulkan only allows resolve operation for color formats");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd94);
    std::__cxx11::string::~string((string *)&ResolveRegion.extent.depth);
  }
  ResolveRegion.extent.height = 1;
  ResolveRegion.srcSubresource.aspectMask = ResolveAttribs->SrcSlice;
  ResolveRegion.srcSubresource.mipLevel = 1;
  local_e8._4_4_ = ResolveAttribs->SrcMipLevel;
  local_e8._0_4_ = 1;
  ResolveRegion.dstSubresource.aspectMask = ResolveAttribs->DstSlice;
  ResolveRegion.dstSubresource.mipLevel = 1;
  ResolveRegion.srcOffset.z = ResolveAttribs->DstMipLevel;
  ResolveRegion.srcOffset.y = 1;
  local_f4 = 0;
  uStack_f0 = 0;
  local_ec = 0;
  ResolveRegion.srcSubresource.baseArrayLayer = 0;
  ResolveRegion.srcSubresource.layerCount = 0;
  ResolveRegion.srcOffset.x = 0;
  MipAttribs._0_4_ = 0;
  MipAttribs._4_4_ = 0;
  local_f8 = 0;
  ResolveRegion.dstSubresource.baseArrayLayer = 0;
  ResolveRegion.dstSubresource.layerCount = 0;
  ResolveRegion.dstOffset.x = 0;
  GetMipLevelProperties(&local_138,TexDesc,ResolveAttribs->SrcMipLevel);
  local_108 = &local_138;
  srcImage = TextureVkImpl::GetVkImage(Texture);
  dstImage = TextureVkImpl::GetVkImage(Texture_00);
  VulkanUtilities::VulkanCommandBuffer::ResolveImage
            (&this->m_CommandBuffer,srcImage,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,dstImage,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,(VkImageResolve *)local_e8);
  return;
}

Assistant:

void DeviceContextVkImpl::ResolveTextureSubresource(ITexture*                               pSrcTexture,
                                                    ITexture*                               pDstTexture,
                                                    const ResolveTextureSubresourceAttribs& ResolveAttribs)
{
    TDeviceContextBase::ResolveTextureSubresource(pSrcTexture, pDstTexture, ResolveAttribs);

    TextureVkImpl*     pSrcTexVk  = ClassPtrCast<TextureVkImpl>(pSrcTexture);
    TextureVkImpl*     pDstTexVk  = ClassPtrCast<TextureVkImpl>(pDstTexture);
    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();

    DEV_CHECK_ERR(SrcTexDesc.Format == DstTexDesc.Format, "Vulkan requires that source and destination textures of a resolve operation "
                                                          "have the same format (18.6)");
    (void)DstTexDesc;

    EnsureVkCmdBuffer();
    // srcImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pSrcTexVk, ResolveAttribs.SrcTextureTransitionMode, RESOURCE_STATE_RESOLVE_SOURCE, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    // dstImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pDstTexVk, ResolveAttribs.DstTextureTransitionMode, RESOURCE_STATE_RESOLVE_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    const TextureFormatAttribs& ResolveFmtAttribs = GetTextureFormatAttribs(SrcTexDesc.Format);
    DEV_CHECK_ERR(ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH && ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL,
                  "Vulkan only allows resolve operation for color formats");
    (void)ResolveFmtAttribs;
    // The aspectMask member of srcSubresource and dstSubresource must only contain VK_IMAGE_ASPECT_COLOR_BIT (18.6)
    VkImageAspectFlags aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;

    VkImageResolve ResolveRegion;
    ResolveRegion.srcSubresource.baseArrayLayer = ResolveAttribs.SrcSlice;
    ResolveRegion.srcSubresource.layerCount     = 1;
    ResolveRegion.srcSubresource.mipLevel       = ResolveAttribs.SrcMipLevel;
    ResolveRegion.srcSubresource.aspectMask     = aspectMask;

    ResolveRegion.dstSubresource.baseArrayLayer = ResolveAttribs.DstSlice;
    ResolveRegion.dstSubresource.layerCount     = 1;
    ResolveRegion.dstSubresource.mipLevel       = ResolveAttribs.DstMipLevel;
    ResolveRegion.dstSubresource.aspectMask     = aspectMask;

    ResolveRegion.srcOffset              = VkOffset3D{};
    ResolveRegion.dstOffset              = VkOffset3D{};
    const MipLevelProperties& MipAttribs = GetMipLevelProperties(SrcTexDesc, ResolveAttribs.SrcMipLevel);
    ResolveRegion.extent                 = VkExtent3D{
        static_cast<uint32_t>(MipAttribs.LogicalWidth),
        static_cast<uint32_t>(MipAttribs.LogicalHeight),
        static_cast<uint32_t>(MipAttribs.Depth)};

    m_CommandBuffer.ResolveImage(pSrcTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                 pDstTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                 1, &ResolveRegion);
}